

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int input_insn_var_iterator_next
              (gen_ctx_t gen_ctx,insn_var_iterator_t *iter,MIR_reg_t *var,int *op_num)

{
  int local_40;
  int local_3c;
  long lStack_38;
  int out_p;
  MIR_op_t *op_ref;
  int *op_num_local;
  MIR_reg_t *var_local;
  insn_var_iterator_t *iter_local;
  gen_ctx_t gen_ctx_local;
  
  op_ref = (MIR_op_t *)op_num;
  op_num_local = (int *)var;
  var_local = (MIR_reg_t *)iter;
  iter_local = (insn_var_iterator_t *)gen_ctx;
  do {
    while( true ) {
      if (*(ulong *)(var_local + 2) <= *(ulong *)(var_local + 4)) {
        return 0;
      }
      *(int *)&op_ref->data = (int)*(undefined8 *)(var_local + 4);
      MIR_insn_op_mode((MIR_context_t)iter_local->insn,*(MIR_insn_t_conflict *)var_local,
                       *(size_t *)(var_local + 4),&local_3c);
      lStack_38 = *(long *)var_local + 0x20 + *(long *)(var_local + 4) * 0x30;
      if ((local_3c == 0) || ((*(ushort *)(lStack_38 + 8) & 0xff) == 0xb)) break;
      *(long *)(var_local + 4) = *(long *)(var_local + 4) + 1;
    }
    while (*(ulong *)(var_local + 6) < 2) {
      if ((*(ushort *)(lStack_38 + 8) & 0xff) != 0xb) {
        if ((*(long *)(var_local + 6) == 0) && ((*(ushort *)(lStack_38 + 8) & 0xff) == 2)) {
          *op_num_local = *(int *)(lStack_38 + 0x10);
LAB_00144dc9:
          *(long *)(var_local + 6) = *(long *)(var_local + 6) + 1;
          return 1;
        }
        break;
      }
      if (*(long *)(var_local + 6) == 0) {
        local_40 = *(int *)(lStack_38 + 0x20);
      }
      else {
        local_40 = *(int *)(lStack_38 + 0x24);
      }
      *op_num_local = local_40;
      if (*op_num_local != -1) goto LAB_00144dc9;
      *(long *)(var_local + 6) = *(long *)(var_local + 6) + 1;
    }
    *(long *)(var_local + 4) = *(long *)(var_local + 4) + 1;
    var_local[6] = 0;
    var_local[7] = 0;
  } while( true );
}

Assistant:

static inline int input_insn_var_iterator_next (gen_ctx_t gen_ctx, insn_var_iterator_t *iter,
                                                MIR_reg_t *var, int *op_num) {
  MIR_op_t *op_ref;
  int out_p;

  while (iter->op_num < iter->nops) {
    *op_num = (int) iter->op_num;
    MIR_insn_op_mode (gen_ctx->ctx, iter->insn, iter->op_num, &out_p);
    op_ref = &iter->insn->ops[iter->op_num];
    if (out_p && op_ref->mode != MIR_OP_VAR_MEM) {
      iter->op_num++;
      continue;
    }
    while (iter->op_part_num < 2) {
      if (op_ref->mode == MIR_OP_VAR_MEM) {
        *var = iter->op_part_num == 0 ? op_ref->u.var_mem.base : op_ref->u.var_mem.index;
        if (*var == MIR_NON_VAR) {
          iter->op_part_num++;
          continue;
        }
      } else if (iter->op_part_num > 0) {
        break;
      } else if (op_ref->mode == MIR_OP_VAR) {
        *var = op_ref->u.var;
      } else
        break;
      iter->op_part_num++;
      return TRUE;
    }
    iter->op_num++;
    iter->op_part_num = 0;
  }
  return FALSE;
}